

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_whitelist_verify
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey)

{
  undefined4 extraout_EAX;
  int iVar1;
  uchar *b32;
  size_t sVar2;
  secp256k1_scalar *r;
  undefined1 auVar3 [16];
  uchar msg32 [32];
  secp256k1_scalar s [256];
  secp256k1_gej pubs [256];
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_whitelist_verify_cold_5();
  }
  else if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_whitelist_verify_cold_4();
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_verify_cold_3();
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_verify_cold_2();
  }
  else {
    if (sub_pubkey != (secp256k1_pubkey *)0x0) {
      if (sig->n_keys != n_keys || 0x100 < sig->n_keys) {
        return 0;
      }
      if (n_keys != 0) {
        b32 = sig->data;
        r = s;
        sVar2 = n_keys;
        do {
          b32 = b32 + 0x20;
          pubs[0].x.n[0]._0_4_ = 0;
          secp256k1_scalar_set_b32(r,b32,(int *)pubs);
          if ((int)pubs[0].x.n[0] != 0) {
            return 0;
          }
          auVar3._0_4_ = -(uint)((int)r->d[0] == 0 && (int)r->d[2] == 0);
          auVar3._4_4_ = -(uint)(*(int *)((long)r->d + 4) == 0 && *(int *)((long)r->d + 0x14) == 0);
          auVar3._8_4_ = -(uint)((int)r->d[1] == 0 && (int)r->d[3] == 0);
          auVar3._12_4_ =
               -(uint)(*(int *)((long)r->d + 0xc) == 0 && *(int *)((long)r->d + 0x1c) == 0);
          iVar1 = movmskps(extraout_EAX,auVar3);
          if (iVar1 == 0xf) {
            return 0;
          }
          r = r + 1;
          sVar2 = sVar2 - 1;
        } while (sVar2 != 0);
      }
      iVar1 = secp256k1_whitelist_compute_keys_and_message
                        (ctx,msg32,pubs,online_pubkeys,offline_pubkeys,(int)n_keys,sub_pubkey);
      if (iVar1 != 0) {
        iVar1 = secp256k1_borromean_verify
                          (&ctx->ecmult_ctx,(secp256k1_scalar *)0x0,sig->data,s,pubs,&sig->n_keys,1,
                           msg32,0x20);
        return iVar1;
      }
      return 0;
    }
    secp256k1_whitelist_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_whitelist_verify(const secp256k1_context* ctx, const secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey) {
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_gej pubs[MAX_KEYS];
    unsigned char msg32[32];
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(sub_pubkey != NULL);

    if (sig->n_keys > MAX_KEYS || sig->n_keys != n_keys) {
        return 0;
    }
    for (i = 0; i < sig->n_keys; i++) {
        int overflow = 0;
        secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&s[i])) {
            return 0;
        }
    }

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    if (!secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, sig->n_keys, sub_pubkey)) {
        return 0;
    }
    /* Do verification */
    return secp256k1_borromean_verify(&ctx->ecmult_ctx, NULL, &sig->data[0], s, pubs, &sig->n_keys, 1, msg32, 32);
}